

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeNVE.cpp
# Opt level: O3

void __thiscall
OpenMD::FluctuatingChargeNVE::FluctuatingChargeNVE(FluctuatingChargeNVE *this,SimInfo *info)

{
  FluctuatingChargePropagator::FluctuatingChargePropagator
            (&this->super_FluctuatingChargePropagator,info);
  (this->super_FluctuatingChargePropagator)._vptr_FluctuatingChargePropagator =
       (_func_int **)&PTR__FluctuatingChargePropagator_002fc2e8;
  this->snap = info->sman_->currentSnapshot_;
  (this->thermo).info_ = info;
  return;
}

Assistant:

FluctuatingChargeNVE::FluctuatingChargeNVE(SimInfo* info) :
      FluctuatingChargePropagator(info),
      snap(info->getSnapshotManager()->getCurrentSnapshot()), thermo(info) {}